

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::safeSpace(JSPrinter *this)

{
  if (this->pretty == true) {
    emit(this,' ');
    return;
  }
  this->possibleSpace = true;
  return;
}

Assistant:

void safeSpace() {
    if (pretty) {
      emit(' ');
    } else {
      possibleSpace = true;
    }
  }